

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O1

EVP_MD * EVP_get_digestbyname(char *name)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  long lVar3;
  EVP_MD *unaff_R14;
  
  lVar3 = 0x18;
  while( true ) {
    __s1 = *(char **)((long)&nid_to_digest_mapping[0].nid + lVar3);
    if (((*(char **)(&UNK_002fb208 + lVar3) != (char *)0x0) &&
        (iVar2 = strcmp(*(char **)(&UNK_002fb208 + lVar3),name), iVar2 == 0)) ||
       ((bVar1 = true, __s1 != (char *)0x0 && (iVar2 = strcmp(__s1,name), iVar2 == 0)))) {
      unaff_R14 = (EVP_MD *)(**(code **)((long)&PTR_anon_var_dwarf_27630e_002fb200 + lVar3))();
      bVar1 = false;
    }
    if (!bVar1) break;
    lVar3 = lVar3 + 0x20;
    if (lVar3 == 600) {
      return (EVP_MD *)0x0;
    }
  }
  return unaff_R14;
}

Assistant:

const EVP_MD *EVP_get_digestbyname(const char *name) {
  for (unsigned i = 0; i < OPENSSL_ARRAY_SIZE(nid_to_digest_mapping); i++) {
    const char *short_name = nid_to_digest_mapping[i].short_name;
    const char *long_name = nid_to_digest_mapping[i].long_name;
    if ((short_name && strcmp(short_name, name) == 0) ||
        (long_name && strcmp(long_name, name) == 0)) {
      return nid_to_digest_mapping[i].md_func();
    }
  }

  return NULL;
}